

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_unix.cpp
# Opt level: O2

QVariant * __thiscall
QSystemLocale::query
          (QVariant *__return_storage_ptr__,QSystemLocale *this,QueryType type,QVariant *in)

{
  double value;
  bool bVar1;
  QTime QVar2;
  MeasurementSystem val;
  CurrencySymbolFormat format;
  DayOfWeek val_00;
  uint uVar3;
  int iVar4;
  QDate QVar5;
  qlonglong value_00;
  qulonglong value_01;
  anon_union_24_3_e3d07ef4_for_data *this_00;
  QString *e;
  undefined8 uVar6;
  long lVar7;
  long in_FS_OFFSET;
  QLatin1StringView other;
  QLatin1StringView other_00;
  QStringView QVar8;
  GroupSizes GVar9;
  QStringBuilder<char16_t,_QStringView_&> local_d8;
  QStringView local_c8;
  QStringView local_b8;
  QStringView local_a8;
  QArrayDataPointer<QString> local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  QReadLocker local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
LAB_003a4a09:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    goto LAB_003a50fd;
  }
  if ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>::
       instance()::holder == '\0') &&
     (iVar4 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                                   ::instance()::holder), iVar4 != 0)) {
    QSystemLocaleData::QSystemLocaleData
              ((QSystemLocaleData *)
               QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
               ::instance()::holder);
    QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>::guard._q_value.
    super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
    __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>::~Holder,
                 QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                 ::instance()::holder,&__dso_handle);
    __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder);
  }
  if (type == LocaleChanged) {
    QSystemLocaleData::readEnvironment
              ((QSystemLocaleData *)
               QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
               ::instance()::holder);
    goto LAB_003a4a09;
  }
  local_40.q_val =
       (quintptr)
       QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>::
       instance()::holder;
  QReadLocker::relock(&local_40);
  switch(type) {
  case DecimalPoint:
    QLocale::decimalPoint
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 8));
    break;
  case Grouping:
    GVar9 = QLocaleData::groupSizes
                      (*(QLocaleData **)
                        QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder._8_8_);
    local_58.shared = GVar9._0_8_;
    local_58._8_4_ = GVar9.least;
    ::QVariant::fromValue<QLocaleData::GroupSizes,_true>
              (__return_storage_ptr__,(GroupSizes *)&local_58);
    goto LAB_003a50f0;
  case GroupSeparator:
    QLocale::groupSeparator
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 8));
    break;
  case ZeroDigit:
    QLocale::zeroDigit((QString *)&local_58,
                       (QLocale *)
                       (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder + 8));
    break;
  case NegativeSign:
    QLocale::negativeSign
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 8));
    break;
  case DateFormatLong:
    QLocale::dateFormat((QString *)&local_58,
                        (QLocale *)
                        (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder + 0x10),LongFormat);
    break;
  case DateFormatShort:
    QLocale::dateFormat((QString *)&local_58,
                        (QLocale *)
                        (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder + 0x10),ShortFormat);
    break;
  case TimeFormatLong:
    QLocale::timeFormat((QString *)&local_58,
                        (QLocale *)
                        (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder + 0x10),LongFormat);
    break;
  case TimeFormatShort:
    QLocale::timeFormat((QString *)&local_58,
                        (QLocale *)
                        (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder + 0x10),ShortFormat);
    break;
  case DayNameLong:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::dayName((QString *)&local_58,
                     (QLocale *)
                     (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                      ::instance()::holder + 0x10),iVar4,LongFormat);
    break;
  case DayNameShort:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::dayName((QString *)&local_58,
                     (QLocale *)
                     (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                      ::instance()::holder + 0x10),iVar4,ShortFormat);
    break;
  case DayNameNarrow:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::dayName((QString *)&local_58,
                     (QLocale *)
                     (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                      ::instance()::holder + 0x10),iVar4,NarrowFormat);
    break;
  case MonthNameLong:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::monthName((QString *)&local_58,
                       (QLocale *)
                       (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder + 0x10),iVar4,LongFormat);
    break;
  case MonthNameShort:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::monthName((QString *)&local_58,
                       (QLocale *)
                       (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder + 0x10),iVar4,ShortFormat);
    break;
  case MonthNameNarrow:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::monthName((QString *)&local_58,
                       (QLocale *)
                       (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                        ::instance()::holder + 0x10),iVar4,NarrowFormat);
    break;
  case DateToStringLong:
    QVar5 = ::QVariant::toDate(in);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),QVar5,LongFormat);
    break;
  case DateToStringShort:
    QVar5 = ::QVariant::toDate(in);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),QVar5,ShortFormat);
    break;
  case TimeToStringLong:
    QVar2 = ::QVariant::toTime(in);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),QVar2,LongFormat);
    break;
  case TimeToStringShort:
    QVar2 = ::QVariant::toTime(in);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),QVar2,ShortFormat);
    break;
  case DateTimeFormatLong:
    QLocale::dateTimeFormat
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),LongFormat);
    break;
  case DateTimeFormatShort:
    QLocale::dateTimeFormat
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),ShortFormat);
    break;
  case DateTimeToStringLong:
    ::QVariant::toDateTime((QVariant *)&local_78);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),(QDateTime *)&local_78.shared,LongFormat);
    goto LAB_003a4e3b;
  case DateTimeToStringShort:
    ::QVariant::toDateTime((QVariant *)&local_78);
    QLocale::toString((QString *)&local_58,
                      (QLocale *)
                      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                       ::instance()::holder + 0x10),(QDateTime *)&local_78.shared,ShortFormat);
LAB_003a4e3b:
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QDateTime::~QDateTime((QDateTime *)&local_78.shared);
    goto LAB_003a50f0;
  case MeasurementSystem:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_4_ = -0x55555556;
    local_58._12_4_ = 0xaaaaaaaa;
    QString::fromLatin1<void>
              ((QString *)&local_58,
               (QByteArray *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x40));
    other.m_data = "Metric";
    other.m_size = 6;
    iVar4 = QString::compare((QString *)&local_58,other,CaseInsensitive);
    if ((iVar4 == 0) ||
       (other_00.m_data = "Other", other_00.m_size = 5,
       iVar4 = QString::compare((QString *)&local_58,other_00,CaseInsensitive), iVar4 == 0)) {
      ::QVariant::QVariant(__return_storage_ptr__,0);
    }
    else {
      QLocale::QLocale((QLocale *)&local_78.shared,(QString *)&local_58);
      val = QLocale::measurementSystem((QLocale *)&local_78.shared);
      ::QVariant::QVariant(__return_storage_ptr__,val);
      QLocale::~QLocale((QLocale *)&local_78.shared);
    }
LAB_003a5446:
    this_00 = &local_58;
    goto LAB_003a50eb;
  case PositiveSign:
    QLocale::positiveSign
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 8));
    break;
  case AMText:
    QLocale::amText((QString *)&local_58,
                    (QLocale *)
                    (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                     ::instance()::holder + 0x10));
    break;
  case PMText:
    QLocale::pmText((QString *)&local_58,
                    (QLocale *)
                    (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                     ::instance()::holder + 0x10));
    break;
  case FirstDayOfWeek:
    val_00 = QLocale::firstDayOfWeek
                       ((QLocale *)
                        (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                         ::instance()::holder + 0x10));
    ::QVariant::QVariant(__return_storage_ptr__,val_00);
    goto LAB_003a50f0;
  default:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    goto LAB_003a50f0;
  case CurrencySymbol:
    format = ::QVariant::toUInt(in,(bool *)0x0);
    QLocale::currencySymbol
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x18),format);
    break;
  case CurrencyToString:
    iVar4 = ::QVariant::typeId(in);
    switch(iVar4) {
    case 2:
      iVar4 = ::QVariant::toInt(in,(bool *)0x0);
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = 0;
      local_78._16_8_ = 0;
      QLocale::toCurrencyString
                ((QString *)&local_58,
                 (QLocale *)
                 (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                  ::instance()::holder + 0x18),iVar4,(QString *)&local_78);
      break;
    case 3:
      uVar3 = ::QVariant::toUInt(in,(bool *)0x0);
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = 0;
      local_78._16_8_ = 0;
      QLocale::toCurrencyString
                ((QString *)&local_58,
                 (QLocale *)
                 (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                  ::instance()::holder + 0x18),(ulong)uVar3,(QString *)&local_78);
      break;
    case 4:
      value_00 = ::QVariant::toLongLong(in,(bool *)0x0);
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = 0;
      local_78._16_8_ = 0;
      QLocale::toCurrencyString
                ((QString *)&local_58,
                 (QLocale *)
                 (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                  ::instance()::holder + 0x18),value_00,(QString *)&local_78);
      break;
    case 5:
      value_01 = ::QVariant::toULongLong(in,(bool *)0x0);
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = 0;
      local_78._16_8_ = 0;
      QLocale::toCurrencyString
                ((QString *)&local_58,
                 (QLocale *)
                 (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                  ::instance()::holder + 0x18),value_01,(QString *)&local_78);
      break;
    case 6:
      value = ::QVariant::toDouble(in,(bool *)0x0);
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = 0;
      local_78._16_8_ = 0;
      QLocale::toCurrencyString
                ((QString *)&local_58,
                 (QLocale *)
                 (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                  ::instance()::holder + 0x18),value,(QString *)&local_78,-1);
      break;
    default:
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      local_58._16_8_ = (undefined1 *)0x0;
      goto LAB_003a50dd;
    }
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    this_00 = &local_78;
    goto LAB_003a50eb;
  case Collation:
    QString::fromLatin1<void>
              ((QString *)&local_58,
               (QByteArray *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x58));
    break;
  case UILanguages:
    if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>::
        instance()::holder._128_8_ == 0) {
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_4_ = -0x55555556;
      local_58._12_4_ = 0xaaaaaaaa;
      qgetenv((QByteArray *)&local_78,"LANGUAGE");
      QString::fromLatin1<void>((QString *)&local_58,(QByteArray *)&local_78);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
      local_78._16_8_ = 0;
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = 0;
      if ((undefined1 *)local_58._16_8_ == (undefined1 *)0x0) {
        QString::fromLatin1<void>
                  ((QString *)&local_98,
                   (QByteArray *)
                   (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                    ::instance()::holder + 0x28));
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,(QString *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      }
      else {
        QString::split((QStringList *)&local_98,(QString *)&local_58,(QChar)0x3a,(SplitBehavior)0x0,
                       CaseSensitive);
        QArrayDataPointer<QString>::operator=((QArrayDataPointer<QString> *)&local_78,&local_98);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
      }
      uVar6 = local_78._8_8_;
      for (lVar7 = local_78._16_8_ * 0x18; lVar7 != 0; lVar7 = lVar7 + -0x18) {
        local_a8.m_size = 0;
        local_a8.m_data = (storage_type_conflict *)0x0;
        local_b8.m_size = 0;
        local_b8.m_data = (storage_type_conflict *)0x0;
        local_c8.m_size = 0;
        local_c8.m_data = (storage_type_conflict *)0x0;
        QVar8.m_data = *(storage_type_conflict **)(uVar6 + 8);
        QVar8.m_size = *(qsizetype *)(uVar6 + 0x10);
        bVar1 = qt_splitLocaleName(QVar8,&local_a8,&local_b8,&local_c8);
        if (bVar1) {
          local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
          if (local_a8.m_size == 0) {
            Qt::Literals::StringLiterals::operator____s((QString *)&local_98,L"und",3);
          }
          else {
            QStringView::toString((QString *)&local_98,&local_a8);
          }
          if (local_b8.m_size != 0) {
            local_d8.a = L'-';
            local_d8.b = &local_b8;
            ::operator+=((QString *)&local_98,&local_d8);
          }
          if (local_c8.m_size != 0) {
            local_d8.a = L'-';
            local_d8.b = &local_c8;
            ::operator+=((QString *)&local_98,&local_d8);
          }
          QList<QString>::emplaceBack<QString_const&>
                    ((QList<QString> *)
                     (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                      ::instance()::holder + 0x70),(QString *)&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        }
        uVar6 = uVar6 + 0x18;
      }
      if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>::
          instance()::holder._128_8_ == 0) {
        (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
        *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      }
      else {
        ::QVariant::QVariant
                  (__return_storage_ptr__,
                   (QStringList *)
                   (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                    ::instance()::holder + 0x70));
      }
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
      goto LAB_003a5446;
    }
    ::QVariant::QVariant
              (__return_storage_ptr__,
               (QStringList *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x70));
    goto LAB_003a50f0;
  case StringToStandardQuotation:
    QVar8 = qvariant_cast<QStringView>(in);
    QLocale::quoteString
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x20),QVar8,StandardQuotation);
    break;
  case StringToAlternateQuotation:
    QVar8 = qvariant_cast<QStringView>(in);
    QLocale::quoteString
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x20),QVar8,AlternateQuotation);
    break;
  case ListToSeparatedString:
    ::QVariant::toStringList((QStringList *)&local_78,in);
    QLocale::createSeparatedList
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x20),(QStringList *)&local_78);
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
    goto LAB_003a50f0;
  case StandaloneMonthNameLong:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneMonthName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar4,LongFormat);
    break;
  case StandaloneMonthNameShort:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneMonthName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar4,ShortFormat);
    break;
  case StandaloneMonthNameNarrow:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneMonthName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar4,NarrowFormat);
    break;
  case StandaloneDayNameLong:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneDayName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar4,LongFormat);
    break;
  case StandaloneDayNameShort:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneDayName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar4,ShortFormat);
    break;
  case StandaloneDayNameNarrow:
    iVar4 = ::QVariant::toInt(in,(bool *)0x0);
    QLocale::standaloneDayName
              ((QString *)&local_58,
               (QLocale *)
               (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qSystemLocaleData>>
                ::instance()::holder + 0x10),iVar4,NarrowFormat);
  }
LAB_003a50dd:
  this_00 = &local_58;
  ::QVariant::QVariant(__return_storage_ptr__,(QString *)this_00);
LAB_003a50eb:
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
LAB_003a50f0:
  QReadLocker::~QReadLocker(&local_40);
LAB_003a50fd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSystemLocale::query(QueryType type, QVariant &&in) const
{
    QSystemLocaleData *d = qSystemLocaleData();
    if (!d)
        return QVariant();

    if (type == LocaleChanged) {
        d->readEnvironment();
        return QVariant();
    }

    QReadLocker locker(&d->lock);

    const QLocale &lc_numeric = d->lc_numeric;
    const QLocale &lc_time = d->lc_time;
    const QLocale &lc_monetary = d->lc_monetary;
    const QLocale &lc_messages = d->lc_messages;

    switch (type) {
    case DecimalPoint:
        return lc_numeric.decimalPoint();
    case Grouping:
        return QVariant::fromValue(lc_numeric.d->m_data->groupSizes());
    case GroupSeparator:
        return lc_numeric.groupSeparator();
    case ZeroDigit:
        return lc_numeric.zeroDigit();
    case NegativeSign:
        return lc_numeric.negativeSign();
    case DateFormatLong:
        return lc_time.dateFormat(QLocale::LongFormat);
    case DateFormatShort:
        return lc_time.dateFormat(QLocale::ShortFormat);
    case TimeFormatLong:
        return lc_time.timeFormat(QLocale::LongFormat);
    case TimeFormatShort:
        return lc_time.timeFormat(QLocale::ShortFormat);
    case DayNameLong:
        return lc_time.dayName(in.toInt(), QLocale::LongFormat);
    case DayNameShort:
        return lc_time.dayName(in.toInt(), QLocale::ShortFormat);
    case DayNameNarrow:
        return lc_time.dayName(in.toInt(), QLocale::NarrowFormat);
    case StandaloneDayNameLong:
        return lc_time.standaloneDayName(in.toInt(), QLocale::LongFormat);
    case StandaloneDayNameShort:
        return lc_time.standaloneDayName(in.toInt(), QLocale::ShortFormat);
    case StandaloneDayNameNarrow:
        return lc_time.standaloneDayName(in.toInt(), QLocale::NarrowFormat);
    case MonthNameLong:
        return lc_time.monthName(in.toInt(), QLocale::LongFormat);
    case MonthNameShort:
        return lc_time.monthName(in.toInt(), QLocale::ShortFormat);
    case MonthNameNarrow:
        return lc_time.monthName(in.toInt(), QLocale::NarrowFormat);
    case StandaloneMonthNameLong:
        return lc_time.standaloneMonthName(in.toInt(), QLocale::LongFormat);
    case StandaloneMonthNameShort:
        return lc_time.standaloneMonthName(in.toInt(), QLocale::ShortFormat);
    case StandaloneMonthNameNarrow:
        return lc_time.standaloneMonthName(in.toInt(), QLocale::NarrowFormat);
    case DateToStringLong:
        return lc_time.toString(in.toDate(), QLocale::LongFormat);
    case DateToStringShort:
        return lc_time.toString(in.toDate(), QLocale::ShortFormat);
    case TimeToStringLong:
        return lc_time.toString(in.toTime(), QLocale::LongFormat);
    case TimeToStringShort:
        return lc_time.toString(in.toTime(), QLocale::ShortFormat);
    case DateTimeFormatLong:
        return lc_time.dateTimeFormat(QLocale::LongFormat);
    case DateTimeFormatShort:
        return lc_time.dateTimeFormat(QLocale::ShortFormat);
    case DateTimeToStringLong:
        return lc_time.toString(in.toDateTime(), QLocale::LongFormat);
    case DateTimeToStringShort:
        return lc_time.toString(in.toDateTime(), QLocale::ShortFormat);
    case PositiveSign:
        return lc_numeric.positiveSign();
    case AMText:
        return lc_time.amText();
    case PMText:
        return lc_time.pmText();
    case FirstDayOfWeek:
        return lc_time.firstDayOfWeek();
    case CurrencySymbol:
        return lc_monetary.currencySymbol(QLocale::CurrencySymbolFormat(in.toUInt()));
    case CurrencyToString: {
        switch (in.userType()) {
        case QMetaType::Int:
            return lc_monetary.toCurrencyString(in.toInt());
        case QMetaType::UInt:
            return lc_monetary.toCurrencyString(in.toUInt());
        case QMetaType::Double:
            return lc_monetary.toCurrencyString(in.toDouble());
        case QMetaType::LongLong:
            return lc_monetary.toCurrencyString(in.toLongLong());
        case QMetaType::ULongLong:
            return lc_monetary.toCurrencyString(in.toULongLong());
        default:
            break;
        }
        return QString();
    }
    case MeasurementSystem: {
        const QString meas_locale = QString::fromLatin1(d->lc_measurement_var);
        if (meas_locale.compare("Metric"_L1, Qt::CaseInsensitive) == 0)
            return QLocale::MetricSystem;
        if (meas_locale.compare("Other"_L1, Qt::CaseInsensitive) == 0)
            return QLocale::MetricSystem;
        return QVariant((int)QLocale(meas_locale).measurementSystem());
    }
    case Collation:
        return QString::fromLatin1(d->lc_collate_var);
    case UILanguages: {
        if (!d->uiLanguages.isEmpty())
            return d->uiLanguages;
        QString languages = QString::fromLatin1(qgetenv("LANGUAGE"));
        QStringList lst;
        if (languages.isEmpty())
            lst.append(QString::fromLatin1(d->lc_messages_var));
        else
            lst = languages.split(u':');

        for (const QString &e : std::as_const(lst)) {
            QStringView language, script, territory;
            if (qt_splitLocaleName(e, &language, &script, &territory)) {
                QString joined = language.isEmpty() ? u"und"_s : language.toString();
                if (!script.isEmpty())
                    joined += u'-' + script;
                if (!territory.isEmpty())
                    joined += u'-' + territory;
                d->uiLanguages.append(joined);
            }
        }
        return d->uiLanguages.isEmpty() ? QVariant() : QVariant(d->uiLanguages);
    }
    case StringToStandardQuotation:
        return lc_messages.quoteString(qvariant_cast<QStringView>(std::move(in)));
    case StringToAlternateQuotation:
        return lc_messages.quoteString(qvariant_cast<QStringView>(std::move(in)),
                                       QLocale::AlternateQuotation);
    case ListToSeparatedString:
        return lc_messages.createSeparatedList(in.toStringList());
    case LocaleChanged:
        Q_ASSERT(false);
        [[fallthrough]];
    default:
        break;
    }
    return QVariant();
}